

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

void lj_ir_growbot(jit_State *J)

{
  uint uVar1;
  IRIns *pIVar2;
  ulong uVar3;
  IRRef IVar4;
  long lVar5;
  uint uVar6;
  IRIns *__src;
  
  uVar1 = J->irbotlim;
  __src = J->irbuf + uVar1;
  IVar4 = (J->cur).nins;
  uVar6 = J->irtoplim - uVar1;
  if (IVar4 + (uVar6 >> 1) < J->irtoplim) {
    uVar6 = uVar6 >> 2;
    memmove(__src + uVar6,__src,(ulong)(IVar4 - uVar1) << 3);
    uVar1 = J->irbotlim - uVar6;
    J->irbotlim = uVar1;
    IVar4 = J->irtoplim - uVar6;
    pIVar2 = __src;
  }
  else {
    pIVar2 = (IRIns *)lj_mem_realloc(J->L,(void *)0x0,0,uVar6 * 0x10);
    uVar1 = uVar6 >> 1;
    if (0xff < uVar6) {
      uVar1 = 0x80;
    }
    memcpy(pIVar2 + uVar1,__src,(ulong)((J->cur).nins - J->irbotlim) << 3);
    uVar3 = (ulong)(J->L->glref).ptr32;
    lVar5 = (ulong)uVar6 * 8;
    *(int *)(uVar3 + 0x50) = *(int *)(uVar3 + 0x50) - (int)lVar5;
    *(long *)(uVar3 + 0x90) = *(long *)(uVar3 + 0x90) + lVar5;
    (**(code **)(uVar3 + 0x40))(*(undefined8 *)(uVar3 + 0x48),__src,lVar5,0);
    uVar1 = J->irbotlim - uVar1;
    J->irbotlim = uVar1;
    IVar4 = uVar1 + uVar6 * 2;
  }
  J->irtoplim = IVar4;
  J->irbuf = pIVar2 + -(ulong)uVar1;
  (J->cur).ir = pIVar2 + -(ulong)uVar1;
  return;
}

Assistant:

static void lj_ir_growbot(jit_State *J)
{
  IRIns *baseir = J->irbuf + J->irbotlim;
  MSize szins = J->irtoplim - J->irbotlim;
  lj_assertJ(szins != 0, "zero IR size");
  lj_assertJ(J->cur.nk == J->irbotlim || J->cur.nk-1 == J->irbotlim,
	     "unexpected IR growth");
  if (J->cur.nins + (szins >> 1) < J->irtoplim) {
    /* More than half of the buffer is free on top: shift up by a quarter. */
    MSize ofs = szins >> 2;
    memmove(baseir + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim -= ofs;
    J->cur.ir = J->irbuf = baseir - J->irbotlim;
  } else {
    /* Double the buffer size, but split the growth amongst top/bottom. */
    IRIns *newbase = lj_mem_newt(J->L, 2*szins*sizeof(IRIns), IRIns);
    MSize ofs = szins >= 256 ? 128 : (szins >> 1);  /* Limit bottom growth. */
    memcpy(newbase + ofs, baseir, (J->cur.nins - J->irbotlim)*sizeof(IRIns));
    lj_mem_free(G(J->L), baseir, szins*sizeof(IRIns));
    J->irbotlim -= ofs;
    J->irtoplim = J->irbotlim + 2*szins;
    J->cur.ir = J->irbuf = newbase - J->irbotlim;
  }
}